

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderGetAttributeNo(xmlTextReaderPtr reader,int no)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlNs *pxVar4;
  _xmlAttr *p_Var5;
  int iVar6;
  
  if (((reader != (xmlTextReaderPtr)0x0) && (pxVar1 = reader->node, pxVar1 != (xmlNodePtr)0x0)) &&
     (reader->curnode == (xmlNodePtr)0x0)) {
    if (pxVar1->type != XML_ELEMENT_NODE) {
      return (xmlChar *)0x0;
    }
    pxVar4 = (xmlNs *)&pxVar1->nsDef;
    iVar6 = 0;
    do {
      iVar2 = iVar6;
      pxVar4 = pxVar4->next;
      if (no <= iVar2) break;
      iVar6 = iVar2 + 1;
    } while (pxVar4 != (xmlNs *)0x0);
    if (pxVar4 != (xmlNs *)0x0) {
      pxVar3 = readerStrdup(reader,pxVar4->href);
      return pxVar3;
    }
    p_Var5 = pxVar1->properties;
    if (p_Var5 != (_xmlAttr *)0x0) {
      if (iVar2 < no) {
        iVar6 = (no - (iVar2 + 1)) + 1;
        do {
          p_Var5 = p_Var5->next;
          if (p_Var5 == (_xmlAttr *)0x0) {
            return (xmlChar *)0x0;
          }
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      if (p_Var5->children != (xmlNode *)0x0) {
        pxVar3 = xmlNodeListGetString(pxVar1->doc,p_Var5->children,1);
        if (pxVar3 != (xmlChar *)0x0) {
          return pxVar3;
        }
        xmlTextReaderErrMemory(reader);
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderGetAttributeNo(xmlTextReaderPtr reader, int no) {
    xmlChar *ret;
    int i;
    xmlAttrPtr cur;
    xmlNsPtr ns;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	return(NULL);
    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(NULL);

    ns = reader->node->nsDef;
    for (i = 0;(i < no) && (ns != NULL);i++) {
	ns = ns->next;
    }
    if (ns != NULL)
	return(readerStrdup(reader, ns->href));

    cur = reader->node->properties;
    if (cur == NULL)
	return(NULL);
    for (;i < no;i++) {
	cur = cur->next;
	if (cur == NULL)
	    return(NULL);
    }
    /* TODO walk the DTD if present */

    if (cur->children == NULL)
        return(NULL);
    ret = xmlNodeListGetString(reader->node->doc, cur->children, 1);
    if (ret == NULL)
        xmlTextReaderErrMemory(reader);
    return(ret);
}